

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checker.cpp
# Opt level: O0

string * sqlcheck::WrapText(string *__return_storage_ptr__,string *text)

{
  bool bVar1;
  istream *piVar2;
  long lVar3;
  ostream *poVar4;
  char *pcVar5;
  bool bVar6;
  ulong local_358;
  size_t space_left;
  undefined1 local_348 [6];
  bool newpara;
  bool newline;
  string word;
  ostringstream local_318 [8];
  ostringstream wrapped;
  istringstream local_1a0 [8];
  istringstream words;
  size_t line_length;
  string *text_local;
  
  std::__cxx11::istringstream::istringstream(local_1a0,text,8);
  std::__cxx11::ostringstream::ostringstream(local_318);
  std::__cxx11::string::string((string *)local_348);
  bVar6 = false;
  piVar2 = std::operator>>((istream *)local_1a0,(string *)local_348);
  bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
  if (bVar1) {
    std::operator<<((ostream *)local_318,(string *)local_348);
    lVar3 = std::__cxx11::string::length();
    local_358 = 0x50 - lVar3;
    while( true ) {
      piVar2 = std::operator>>((istream *)local_1a0,(string *)local_348);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
      if (!bVar1) break;
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_348,anon_var_dwarf_56a58);
      if (bVar1) {
        std::operator<<((ostream *)local_318,"\n\n");
      }
      lVar3 = std::__cxx11::string::length();
      if ((local_358 < lVar3 + 1U) || (bVar6)) {
        poVar4 = std::operator<<((ostream *)local_318,'\n');
        std::operator<<(poVar4,(string *)local_348);
        lVar3 = std::__cxx11::string::length();
        local_358 = 0x50 - lVar3;
      }
      else {
        if (bVar1) {
          std::operator<<((ostream *)local_318,(string *)local_348);
        }
        else {
          poVar4 = std::operator<<((ostream *)local_318,' ');
          std::operator<<(poVar4,(string *)local_348);
        }
        lVar3 = std::__cxx11::string::length();
        local_358 = local_358 - (lVar3 + 1);
      }
      pcVar5 = (char *)std::__cxx11::string::back();
      bVar6 = *pcVar5 == ':';
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::~string((string *)local_348);
  std::__cxx11::ostringstream::~ostringstream(local_318);
  std::__cxx11::istringstream::~istringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string WrapText(const std::string& text){

  size_t line_length = 80;

  std::istringstream words(text);
  std::ostringstream wrapped;
  std::string word;
  bool newline = false;
  bool newpara = false;

  if (words >> word) {

    wrapped << word;

    size_t space_left = line_length - word.length();
    while (words >> word) {
      if(word == "●"){
        wrapped << "\n\n";
        newpara = true;
      }
      else{
        newpara = false;
      }

      if (space_left < word.length() + 1 || newline) {
        wrapped << '\n' << word;
        space_left = line_length - word.length();
      }
      else {
        if(newpara == false){
          wrapped << ' ' << word;
        }
        else{
          wrapped << word;
        }
        space_left -= word.length() + 1;
      }

      if(word.back() == ':'){
        newline = true;
      }
      else{
        newline = false;
      }
    }

  }

  return wrapped.str();
}